

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O3

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)4>::fetch_sprite
          (SMSFetcher<(TI::TMS::Personality)4> *this,int sprite)

{
  ushort uVar1;
  int iVar2;
  Base<(TI::TMS::Personality)4> *pBVar3;
  Storage<(TI::TMS::Personality)4,_void> *pSVar4;
  iterator pvVar5;
  uint uVar6;
  ulong uVar7;
  
  pBVar3 = this->base;
  pSVar4 = this->storage;
  pvVar5 = pBVar3->fetch_sprite_buffer_;
  uVar1 = pSVar4->sprite_attribute_table_address_;
  iVar2 = pvVar5->active_sprites[sprite].row;
  uVar6 = pvVar5->active_sprites[sprite].index * 2;
  pvVar5->active_sprites[sprite].x =
       (uint)(pBVar3->ram_)._M_elems[(uVar6 | 0xff80) & (uint)uVar1] +
       (pSVar4->shift_sprites_8px_left_ ^ 1) * 8 + -8;
  uVar7 = (ulong)((iVar2 << 2 |
                   (~(uint)pBVar3->sprites_16x16_ &
                   (uint)(pBVar3->ram_)._M_elems[(uVar6 | 0xff81) & (uint)uVar1]) << 5 | 0xe000) &
                 (uint)pSVar4->sprite_generator_table_address_);
  pvVar5->active_sprites[sprite].image[0] = (pBVar3->ram_)._M_elems[uVar7];
  pvVar5->active_sprites[sprite].image[1] = (this->base->ram_)._M_elems[uVar7 + 1];
  pvVar5->active_sprites[sprite].image[2] = (this->base->ram_)._M_elems[uVar7 + 2];
  pvVar5->active_sprites[sprite].image[3] = (this->base->ram_)._M_elems[uVar7 + 3];
  return;
}

Assistant:

void fetch_sprite(int sprite) {
		auto &sprite_buffer = *base->fetch_sprite_buffer_;
		sprite_buffer.active_sprites[sprite].x =
			base->ram_[
				storage->sprite_attribute_table_address_ & bits<7>((sprite_buffer.active_sprites[sprite].index << 1) | 0)
			] - (storage->shift_sprites_8px_left_ ? 8 : 0);
		const uint8_t name = base->ram_[
				storage->sprite_attribute_table_address_ & bits<7>((sprite_buffer.active_sprites[sprite].index << 1) | 1)
			] & (base->sprites_16x16_ ? ~1 : ~0);

		const AddressT graphic_location =
			storage->sprite_generator_table_address_ &
			bits<13>(AddressT((name << 5) | (sprite_buffer.active_sprites[sprite].row << 2)));
		sprite_buffer.active_sprites[sprite].image[0] = base->ram_[graphic_location];
		sprite_buffer.active_sprites[sprite].image[1] = base->ram_[graphic_location+1];
		sprite_buffer.active_sprites[sprite].image[2] = base->ram_[graphic_location+2];
		sprite_buffer.active_sprites[sprite].image[3] = base->ram_[graphic_location+3];
	}